

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<DataStream,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer puVar1;
  iterator __position;
  uint64_t uVar2;
  size_t in_RCX;
  ulong uVar3;
  uint64_t __n;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  uVar2 = ReadCompactSize<DataStream>(s,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x1312d0;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(v,__n);
      while (__position._M_current =
                  (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish,
            (ulong)((long)__position._M_current -
                    (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 2) < __n) {
        if (__position._M_current ==
            (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<>
                    (v,__position);
        }
        else {
          *__position._M_current = 0;
          (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        DataStream::read(s,(int)&local_3c,(void *)0x4,in_RCX);
        puVar1[-1] = local_3c;
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }